

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O2

void __thiscall
soplex::SPxLPBase<double>::writeMPS
          (SPxLPBase<double> *this,ostream *p_output,NameSet *p_rnames,NameSet *p_cnames,
          DIdxSet *p_intvars,bool writeZeroObjective)

{
  Item *pIVar1;
  Item *pIVar2;
  Nonzero<double> *pNVar3;
  SPxOut *pSVar4;
  bool bVar5;
  Real RVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  ostream *poVar10;
  char *pcVar11;
  double *pdVar12;
  SPxInternalCodeException *this_00;
  char *name2_00;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  int p_idx;
  bool bVar16;
  char *pcVar17;
  ulong uVar18;
  uint uVar19;
  long lVar20;
  long lVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  double dVar26;
  int local_e4;
  undefined4 local_cc;
  double local_c8;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  long local_b0;
  char name1 [16];
  char name [16];
  Verbosity old_verbosity;
  undefined4 uStack_64;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60 [3];
  char name2 [16];
  
  lVar21 = *(long *)p_output;
  *(undefined8 *)(p_output + *(long *)(lVar21 + -0x18) + 8) = 0x10;
  lVar21 = *(long *)(lVar21 + -0x18);
  *(uint *)(p_output + lVar21 + 0x18) = *(uint *)(p_output + lVar21 + 0x18) & 0xfffffefb | 0x100;
  poVar10 = std::operator<<(p_output,"NAME          MPSDATA");
  std::endl<char,std::char_traits<char>>(poVar10);
  poVar10 = std::operator<<(p_output,"ROWS");
  std::endl<char,std::char_traits<char>>(poVar10);
  bVar16 = false;
  for (lVar21 = 0; lVar21 < (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
      lVar21 = lVar21 + 1) {
    dVar26 = (this->super_LPRowSetBase<double>).left.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[lVar21];
    pdVar12 = (this->super_LPRowSetBase<double>).right.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start + lVar21;
    if ((dVar26 != *pdVar12) || (NAN(dVar26) || NAN(*pdVar12))) {
      pdVar12 = (double *)infinity();
      if (-*pdVar12 < dVar26) {
        dVar26 = (this->super_LPRowSetBase<double>).right.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar21];
        pdVar12 = (double *)infinity();
        pcVar17 = "E";
        bVar5 = true;
        if (dVar26 < *pdVar12) goto LAB_00182e93;
      }
      dVar26 = (this->super_LPRowSetBase<double>).left.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[lVar21];
      pdVar12 = (double *)infinity();
      if (dVar26 <= -*pdVar12) {
        dVar26 = (this->super_LPRowSetBase<double>).right.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar21];
        pdVar12 = (double *)infinity();
        pcVar17 = "L";
        bVar5 = bVar16;
        if (*pdVar12 <= dVar26) {
          this_00 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
          std::__cxx11::string::string
                    ((string *)&old_verbosity,"XMPSWR02 This should never happen.",
                     (allocator *)&local_cc);
          SPxInternalCodeException::SPxInternalCodeException(this_00,(string *)&old_verbosity);
          __cxa_throw(this_00,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
        }
      }
      else {
        pcVar17 = "G";
        bVar5 = bVar16;
      }
    }
    else {
      pcVar17 = "E";
      bVar5 = bVar16;
    }
LAB_00182e93:
    bVar16 = bVar5;
    pcVar11 = MPSgetRowName<double>(this,(int)lVar21,p_rnames,name);
    MPSwriteRecord<double>(p_output,pcVar17,pcVar11,(char *)0x0,0.0,(char *)0x0,0.0);
  }
  MPSwriteRecord<double>(p_output,"N","MINIMIZE",(char *)0x0,0.0,(char *)0x0,0.0);
  poVar10 = std::operator<<(p_output,"COLUMNS");
  std::endl<char,std::char_traits<char>>(poVar10);
  if (p_intvars == (DIdxSet *)0x0) {
    local_e4 = 1;
    bVar5 = false;
  }
  else {
    bVar5 = 0 < (p_intvars->super_IdxSet).num;
    local_e4 = bVar5 + 1;
  }
  for (iVar9 = 0; iVar9 != local_e4; iVar9 = iVar9 + 1) {
    bVar7 = (bool)(iVar9 == 1 & bVar5);
    if (bVar7 == true) {
      poVar10 = std::operator<<(p_output,"    MARK0001  \'MARKER\'                 \'INTORG\'");
      std::endl<char,std::char_traits<char>>(poVar10);
    }
    for (lVar21 = 0; lVar21 < (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum;
        lVar21 = lVar21 + 1) {
      if (bVar5 == false) {
LAB_001830f4:
        pIVar2 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.theitem;
        iVar8 = (this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thekey[lVar21].idx;
        pIVar1 = pIVar2 + iVar8;
        iVar8 = (pIVar2[iVar8].data.super_SVectorBase<double>.memused / 2) * 2;
        lVar20 = 0;
        local_b0 = lVar21;
        for (lVar13 = 0; lVar21 = local_b0, p_idx = (int)local_b0, lVar13 < iVar8;
            lVar13 = lVar13 + 2) {
          pcVar17 = getColName<double>(this,p_idx,p_cnames,name);
          pcVar11 = MPSgetRowName<double>
                              (this,*(int *)((long)&((pIVar1->data).super_SVectorBase<double>.m_elem
                                                    )->idx + lVar20),p_rnames,name1);
          pNVar3 = (pIVar1->data).super_SVectorBase<double>.m_elem;
          local_c8 = *(double *)((long)&pNVar3->val + lVar20);
          name2_00 = MPSgetRowName<double>
                               (this,*(int *)((long)&pNVar3[1].idx + lVar20),p_rnames,name2);
          MPSwriteRecord<double>
                    (p_output,(char *)0x0,pcVar17,pcVar11,local_c8,name2_00,
                     *(double *)
                      ((long)&(pIVar1->data).super_SVectorBase<double>.m_elem[1].val + lVar20));
          lVar20 = lVar20 + 0x20;
        }
        if (iVar8 != (pIVar1->data).super_SVectorBase<double>.memused) {
          pcVar17 = getColName<double>(this,p_idx,p_cnames,name);
          pcVar11 = MPSgetRowName<double>
                              (this,*(int *)((long)&((pIVar1->data).super_SVectorBase<double>.m_elem
                                                    )->idx + lVar20),p_rnames,name1);
          MPSwriteRecord<double>
                    (p_output,(char *)0x0,pcVar17,pcVar11,
                     *(double *)
                      ((long)&((pIVar1->data).super_SVectorBase<double>.m_elem)->val + lVar20),
                     (char *)0x0,0.0);
        }
        dVar26 = (this->super_LPColSetBase<double>).object.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar21];
        std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&old_verbosity,
                   &(this->_tolerances).
                    super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
        RVar6 = Tolerances::epsilon((Tolerances *)CONCAT44(uStack_64,old_verbosity));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_60);
        if (writeZeroObjective || RVar6 < ABS(dVar26)) {
          pcVar17 = getColName<double>(this,p_idx,p_cnames,name);
          MPSwriteRecord<double>
                    (p_output,(char *)0x0,pcVar17,"MINIMIZE",
                     -(this->super_LPColSetBase<double>).object.val.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar21],(char *)0x0,0.0);
        }
      }
      else {
        iVar8 = IdxSet::pos(&p_intvars->super_IdxSet,(int)lVar21);
        if (-1 < iVar8 == bVar7) goto LAB_001830f4;
      }
    }
    if (bVar7 != false) {
      poVar10 = std::operator<<(p_output,"    MARK0001  \'MARKER\'                 \'INTEND\'");
      std::endl<char,std::char_traits<char>>(poVar10);
    }
  }
  poVar10 = std::operator<<(p_output,"RHS");
  std::endl<char,std::char_traits<char>>(poVar10);
  uVar14 = 0;
  while( true ) {
    iVar9 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
    iVar8 = (int)uVar14;
    if (iVar9 <= iVar8) break;
    uVar15 = iVar8 + 2;
    uVar22 = 0;
    uVar24 = 0;
    uVar14 = (ulong)iVar8;
    uVar18 = uVar14;
    for (; uVar18 = uVar18 + 1, (long)uVar14 < (long)iVar9; uVar14 = uVar14 + 1) {
      dVar26 = MPSgetRHS<double>((this->super_LPRowSetBase<double>).left.val.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start[uVar14],
                                 (this->super_LPRowSetBase<double>).right.val.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start[uVar14]);
      uVar22 = SUB84(dVar26,0);
      uVar24 = (undefined4)((ulong)dVar26 >> 0x20);
      iVar9 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
      if ((dVar26 != 0.0) || (NAN(dVar26))) break;
      uVar15 = uVar15 + 1;
    }
    iVar8 = (int)uVar14;
    if (iVar8 < iVar9) {
      uVar23 = 0;
      uVar25 = 0;
      do {
        uVar19 = uVar15;
        uVar14 = (ulong)uVar19;
        iVar9 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
        if ((long)iVar9 <= (long)uVar18) {
          local_c8 = (double)CONCAT44(uVar25,uVar23);
          goto LAB_0018341b;
        }
        dVar26 = MPSgetRHS<double>((this->super_LPRowSetBase<double>).left.val.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start[uVar18],
                                   (this->super_LPRowSetBase<double>).right.val.
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start[uVar18]);
        uVar23 = SUB84(dVar26,0);
        uVar25 = (undefined4)((ulong)dVar26 >> 0x20);
        uVar18 = uVar18 + 1;
      } while ((dVar26 == 0.0) && (uVar15 = uVar19 + 1, !NAN(dVar26)));
      iVar9 = (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
      local_c8 = dVar26;
LAB_0018341b:
      pcVar17 = MPSgetRowName<double>(this,iVar8,p_rnames,name1);
      if ((int)(uVar19 - 1) < iVar9) {
        pcVar11 = MPSgetRowName<double>(this,uVar19 - 1,p_rnames,name2);
        dVar26 = local_c8;
      }
      else {
        dVar26 = 0.0;
        pcVar11 = (char *)0x0;
      }
      MPSwriteRecord<double>
                (p_output,(char *)0x0,"RHS",pcVar17,(double)CONCAT44(uVar24,uVar22),pcVar11,dVar26);
    }
  }
  if (bVar16) {
    poVar10 = std::operator<<(p_output,"RANGES");
    std::endl<char,std::char_traits<char>>(poVar10);
    for (lVar21 = 0; lVar21 < (this->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum;
        lVar21 = lVar21 + 1) {
      dVar26 = (this->super_LPRowSetBase<double>).left.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[lVar21];
      pdVar12 = (double *)infinity();
      if (-*pdVar12 < dVar26) {
        dVar26 = (this->super_LPRowSetBase<double>).right.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar21];
        pdVar12 = (double *)infinity();
        if (dVar26 < *pdVar12) {
          pcVar17 = MPSgetRowName<double>(this,(int)lVar21,p_rnames,name1);
          MPSwriteRecord<double>
                    (p_output,"","RANGE",pcVar17,
                     (this->super_LPRowSetBase<double>).right.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar21] -
                     (this->super_LPRowSetBase<double>).left.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar21],(char *)0x0,0.0);
        }
      }
    }
  }
  poVar10 = std::operator<<(p_output,"BOUNDS");
  std::endl<char,std::char_traits<char>>(poVar10);
  lVar21 = 0;
  do {
    if ((this->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum <= lVar21) {
      poVar10 = std::operator<<(p_output,"ENDATA");
      std::endl<char,std::char_traits<char>>(poVar10);
      if (((this->thesense == MAXIMIZE) && (pSVar4 = this->spxout, pSVar4 != (SPxOut *)0x0)) &&
         (old_verbosity = pSVar4->m_verbosity, 0 < (int)old_verbosity)) {
        local_cc = 1;
        (*pSVar4->_vptr_SPxOut[2])();
        soplex::operator<<(this->spxout,
                           "XMPSWR03 Warning: objective function inverted when writing maximization problem in MPS file format\n"
                          );
        (*this->spxout->_vptr_SPxOut[2])(this->spxout,&old_verbosity);
      }
      return;
    }
    dVar26 = (this->super_LPColSetBase<double>).low.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[lVar21];
    pdVar12 = (this->super_LPColSetBase<double>).up.val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start + lVar21;
    iVar9 = (int)lVar21;
    if ((dVar26 != *pdVar12) || (NAN(dVar26) || NAN(*pdVar12))) {
      pdVar12 = (double *)infinity();
      if (dVar26 <= -*pdVar12) {
        dVar26 = (this->super_LPColSetBase<double>).up.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar21];
        pdVar12 = (double *)infinity();
        if (*pdVar12 <= dVar26) {
          pcVar17 = getColName<double>(this,iVar9,p_cnames,name1);
          uVar22 = 0;
          uVar24 = 0;
          pcVar11 = "FR";
          goto LAB_0018379d;
        }
      }
      dVar26 = (this->super_LPColSetBase<double>).low.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[lVar21];
      if ((dVar26 != 0.0) || (NAN(dVar26))) {
        pdVar12 = (double *)infinity();
        local_c8 = -*pdVar12;
        uStack_c0 = 0;
        uStack_bc = 0x80000000;
        pcVar17 = getColName<double>(this,iVar9,p_cnames,name1);
        if (dVar26 <= local_c8) {
          uVar22 = 0;
          uVar24 = 0;
          pcVar11 = "MI";
        }
        else {
          dVar26 = (this->super_LPColSetBase<double>).low.val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar21];
          uVar22 = SUB84(dVar26,0);
          uVar24 = (undefined4)((ulong)dVar26 >> 0x20);
          pcVar11 = "LO";
        }
        MPSwriteRecord<double>
                  (p_output,pcVar11,"BOUND",pcVar17,(double)CONCAT44(uVar24,uVar22),(char *)0x0,0.0)
        ;
      }
      if (bVar5 != false) {
        iVar8 = IdxSet::pos(&p_intvars->super_IdxSet,iVar9);
        if (iVar8 < 0) goto LAB_00183749;
LAB_0018376d:
        pcVar17 = getColName<double>(this,iVar9,p_cnames,name1);
        dVar26 = (this->super_LPColSetBase<double>).up.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar21];
        uVar22 = SUB84(dVar26,0);
        uVar24 = (undefined4)((ulong)dVar26 >> 0x20);
        pcVar11 = "UP";
        goto LAB_0018379d;
      }
LAB_00183749:
      dVar26 = (this->super_LPColSetBase<double>).up.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[lVar21];
      pdVar12 = (double *)infinity();
      if (dVar26 < *pdVar12) goto LAB_0018376d;
    }
    else {
      pcVar17 = getColName<double>(this,iVar9,p_cnames,name1);
      dVar26 = (this->super_LPColSetBase<double>).low.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[lVar21];
      uVar22 = SUB84(dVar26,0);
      uVar24 = (undefined4)((ulong)dVar26 >> 0x20);
      pcVar11 = "FX";
LAB_0018379d:
      MPSwriteRecord<double>
                (p_output,pcVar11,"BOUND",pcVar17,(double)CONCAT44(uVar24,uVar22),(char *)0x0,0.0);
    }
    lVar21 = lVar21 + 1;
  } while( true );
}

Assistant:

inline
void SPxLPBase<R>::writeMPS(
   std::ostream&  p_output,          ///< output stream.
   const NameSet* p_rnames,          ///< row names.
   const NameSet* p_cnames,          ///< column names.
   const DIdxSet* p_intvars,         ///< integer variables.
   const bool     writeZeroObjective ///< write zero objective coefficients
) const
{

   const char*    indicator;
   char           name [16];
   char           name1[16];
   char           name2[16];
   bool           has_ranges = false;
   int            i;
   int            k;

   SPxOut::setScientific(p_output, 16);
   // --- NAME Section ---
   p_output << "NAME          MPSDATA" << std::endl;

   // --- ROWS Section ---
   p_output << "ROWS" << std::endl;

   for(i = 0; i < nRows(); i++)
   {
      if(lhs(i) == rhs(i))
         indicator = "E";
      else if((lhs(i) > R(-infinity)) && (rhs(i) < R(infinity)))
      {
         indicator = "E";
         has_ranges = true;
      }
      else if(lhs(i) > R(-infinity))
         indicator = "G";
      else if(rhs(i) <  R(infinity))
         indicator = "L";
      else
         throw SPxInternalCodeException("XMPSWR02 This should never happen.");

      MPSwriteRecord<R>(p_output, indicator, MPSgetRowName(*this, i, p_rnames, name));
   }

   MPSwriteRecord<R>(p_output, "N", "MINIMIZE");

   // --- COLUMNS Section ---
   p_output << "COLUMNS" << std::endl;

   bool has_intvars = (p_intvars != nullptr) && (p_intvars->size() > 0);

   for(int j = 0; j < (has_intvars ? 2 : 1); j++)
   {
      bool is_intrun = has_intvars && (j == 1);

      if(is_intrun)
         p_output << "    MARK0001  'MARKER'                 'INTORG'" << std::endl;

      for(i = 0; i < nCols(); i++)
      {
         bool is_intvar = has_intvars && (p_intvars->pos(i) >= 0);

         if((is_intrun && !is_intvar) || (!is_intrun &&  is_intvar))
            continue;

         const SVectorBase<R>& col = colVector(i);
         int colsize2 = (col.size() / 2) * 2;

         assert(colsize2 % 2 == 0);

         for(k = 0; k < colsize2; k += 2)
            MPSwriteRecord(p_output, nullptr, getColName(*this, i, p_cnames, name),
                           MPSgetRowName(*this, col.index(k), p_rnames, name1), col.value(k),
                           MPSgetRowName(*this, col.index(k + 1), p_rnames, name2), col.value(k + 1));

         if(colsize2 != col.size())
            MPSwriteRecord(p_output, nullptr, getColName(*this, i, p_cnames, name),
                           MPSgetRowName(*this, col.index(k), p_rnames, name1), col.value(k));

         if(isNotZero(maxObj(i), this->tolerances()->epsilon()) || writeZeroObjective)
            MPSwriteRecord(p_output, nullptr, getColName(*this, i, p_cnames, name), "MINIMIZE", -maxObj(i));
      }

      if(is_intrun)
         p_output << "    MARK0001  'MARKER'                 'INTEND'" << std::endl;
   }

   // --- RHS Section ---
   p_output << "RHS" << std::endl;

   i = 0;

   while(i < nRows())
   {
      R rhsval1 = 0.0;
      R rhsval2 = 0.0;

      for(; i < nRows(); i++)
         if((rhsval1 = MPSgetRHS(lhs(i), rhs(i))) != 0.0)
            break;

      if(i < nRows())
      {
         for(k = i + 1; k < nRows(); k++)
         {
            if((rhsval2 = MPSgetRHS(lhs(k), rhs(k))) != 0.0)
               break;
         }

         if(k < nRows())
         {
            MPSwriteRecord(p_output, nullptr, "RHS", MPSgetRowName(*this, i, p_rnames, name1), rhsval1,
                           MPSgetRowName(*this, k, p_rnames, name2), rhsval2);
         }
         else
            MPSwriteRecord(p_output, nullptr, "RHS", MPSgetRowName(*this, i, p_rnames, name1), rhsval1);

         i = k + 1;
      }
   }

   // --- RANGES Section ---
   if(has_ranges)
   {
      p_output << "RANGES" << std::endl;

      for(i = 0; i < nRows(); i++)
      {
         if((lhs(i) > R(-infinity)) && (rhs(i) < R(infinity)))
            MPSwriteRecord(p_output, "", "RANGE", MPSgetRowName(*this, i, p_rnames, name1), rhs(i) - lhs(i));
      }
   }

   // --- BOUNDS Section ---
   p_output << "BOUNDS" << std::endl;

   for(i = 0; i < nCols(); i++)
   {
      if(lower(i) == upper(i))
      {
         MPSwriteRecord(p_output, "FX", "BOUND", getColName(*this, i, p_cnames, name1), lower(i));
         continue;
      }

      if((lower(i) <= R(-infinity)) && (upper(i) >= R(infinity)))
      {
         MPSwriteRecord<R>(p_output, "FR", "BOUND", getColName(*this, i, p_cnames, name1));
         continue;
      }

      if(lower(i) != 0.0)
      {
         if(lower(i) > R(-infinity))
            MPSwriteRecord(p_output, "LO", "BOUND", getColName(*this, i, p_cnames, name1), lower(i));
         else
            MPSwriteRecord<R>(p_output, "MI", "BOUND", getColName(*this, i, p_cnames, name1));
      }

      if(has_intvars && (p_intvars->pos(i) >= 0))
      {
         // Integer variables have default upper bound 1.0, but we should write
         // it nevertheless since CPLEX seems to assume R(infinity) otherwise.
         MPSwriteRecord(p_output, "UP", "BOUND", getColName(*this, i, p_cnames, name1), upper(i));
      }
      else
      {
         // Continous variables have default upper bound R(infinity)
         if(upper(i) < R(infinity))
            MPSwriteRecord(p_output, "UP", "BOUND", getColName(*this, i, p_cnames, name1), upper(i));
      }
   }

   // --- ENDATA Section ---
   p_output << "ENDATA" << std::endl;

   // Output warning when writing a maximisation problem
   if(spxSense() == SPxLPBase<R>::MAXIMIZE)
   {
      SPX_MSG_WARNING((*spxout), (*spxout) <<
                      "XMPSWR03 Warning: objective function inverted when writing maximization problem in MPS file format\n");
   }
}